

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx512::PointsISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,PointsISA *this,PrimRef *prims,range<unsigned_long> *r,
          size_t k,uint geomID)

{
  BufferView<embree::Vec3fx> *pBVar1;
  char *pcVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  uint index;
  unsigned_long uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar11 = r->_begin;
  auVar15._8_4_ = 0x7f800000;
  auVar15._0_8_ = 0x7f8000007f800000;
  auVar15._12_4_ = 0x7f800000;
  auVar16 = ZEXT1664(auVar15);
  auVar13._8_4_ = 0xff800000;
  auVar13._0_8_ = 0xff800000ff800000;
  auVar13._12_4_ = 0xff800000;
  auVar14 = ZEXT1664(auVar13);
  sVar8 = 0;
  auVar17._8_4_ = 0xddccb9a2;
  auVar17._0_8_ = 0xddccb9a2ddccb9a2;
  auVar17._12_4_ = 0xddccb9a2;
  auVar18._8_4_ = 0x5dccb9a2;
  auVar18._0_8_ = 0x5dccb9a25dccb9a2;
  auVar18._12_4_ = 0x5dccb9a2;
  auVar19 = ZEXT1664(auVar13);
  auVar20 = ZEXT1664(auVar15);
  while( true ) {
    if (r->_end <= uVar11) break;
    pBVar1 = (this->super_Points).vertices.items;
    sVar9 = k;
    if ((uVar11 & 0xffffffff) < (pBVar1->super_RawBufferView).num) {
      lVar10 = (uVar11 & 0xffffffff) * (pBVar1->super_RawBufferView).stride;
      pcVar2 = (pBVar1->super_RawBufferView).ptr_ofs;
      auVar13 = *(undefined1 (*) [16])(pcVar2 + lVar10);
      uVar6 = vcmpps_avx512vl(auVar13,auVar17,6);
      uVar7 = vcmpps_avx512vl(auVar13,auVar18,1);
      if (((byte)((byte)uVar6 & (byte)uVar7) == 0xf) && (0.0 <= *(float *)(pcVar2 + lVar10 + 0xc)))
      {
        lVar10 = *(long *)&(this->super_Points).super_Geometry.field_0x58;
        lVar12 = *(long *)&(this->super_Points).field_0x68 * uVar11;
        auVar13 = *(undefined1 (*) [16])(lVar10 + lVar12);
        fVar5 = *(float *)(lVar10 + 0xc + lVar12) * (this->super_Points).maxRadiusScale;
        auVar22._4_4_ = fVar5;
        auVar22._0_4_ = fVar5;
        auVar22._8_4_ = fVar5;
        auVar22._12_4_ = fVar5;
        auVar15 = vsubps_avx(auVar13,auVar22);
        aVar3 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar15,ZEXT416(geomID),0x30);
        auVar21._0_4_ = auVar13._0_4_ + fVar5;
        auVar21._4_4_ = auVar13._4_4_ + fVar5;
        auVar21._8_4_ = auVar13._8_4_ + fVar5;
        auVar21._12_4_ = auVar13._12_4_ + fVar5;
        aVar4 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar21,ZEXT416((uint)uVar11),0x30);
        auVar13 = vminps_avx((undefined1  [16])auVar20._0_16_,(undefined1  [16])aVar3);
        auVar20 = ZEXT1664(auVar13);
        auVar13 = vmaxps_avx((undefined1  [16])auVar19._0_16_,(undefined1  [16])aVar4);
        auVar19 = ZEXT1664(auVar13);
        auVar23._0_4_ = aVar3.x + aVar4.x;
        auVar23._4_4_ = aVar3.y + aVar4.y;
        auVar23._8_4_ = aVar3.z + aVar4.z;
        auVar23._12_4_ = aVar3.field_3.w + aVar4.field_3.w;
        auVar13 = vminps_avx((undefined1  [16])auVar16._0_16_,auVar23);
        auVar16 = ZEXT1664(auVar13);
        auVar13 = vmaxps_avx((undefined1  [16])auVar14._0_16_,auVar23);
        auVar14 = ZEXT1664(auVar13);
        sVar8 = sVar8 + 1;
        sVar9 = k + 1;
        prims[k].upper.field_0.field_1 = aVar4;
        prims[k].lower.field_0.field_1 = aVar3;
      }
    }
    uVar11 = uVar11 + 1;
    k = sVar9;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       auVar20._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       auVar19._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       auVar16._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       auVar14._0_16_;
  __return_storage_ptr__->end = sVar8;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, &bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }